

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Dropout_x86::forward_inplace(Dropout_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined8 uVar6;
  float *pfVar7;
  Mat *in_RSI;
  long *in_RDI;
  __m128 _p_2;
  int i_2;
  float *ptr_2;
  int q;
  __m128 _p_1;
  int j;
  float *ptr_1;
  int i_1;
  __m128 _p;
  float *ptr;
  int i;
  __m128 _scale;
  int size;
  int channels;
  int h;
  int w;
  int elempack;
  int dims;
  undefined8 local_208;
  float fStack_200;
  Mat *in_stack_fffffffffffffe08;
  int local_1f0;
  Mat local_1e0;
  Option *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int iVar8;
  Dropout *in_stack_fffffffffffffe78;
  undefined8 uStack_180;
  int local_16c;
  float *local_168;
  int local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  int local_13c;
  int local_ec;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  
  fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  if ((fVar1 != 1.0) || (NAN(fVar1))) {
    iVar8 = in_RSI->dims;
    if (in_RSI->elempack == 4) {
      iVar2 = in_RSI->w;
      iVar3 = in_RSI->h;
      iVar4 = in_RSI->c;
      fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      if (iVar8 == 1) {
        for (local_13c = 0; local_13c < iVar2; local_13c = local_13c + 1) {
          pfVar7 = ncnn::Mat::operator_cast_to_float_(in_RSI);
          pfVar7 = pfVar7 + (local_13c << 2);
          local_68 = (float)*(undefined8 *)pfVar7;
          fStack_64 = (float)((ulong)*(undefined8 *)pfVar7 >> 0x20);
          fStack_60 = (float)*(undefined8 *)(pfVar7 + 2);
          fStack_5c = (float)((ulong)*(undefined8 *)(pfVar7 + 2) >> 0x20);
          local_158 = CONCAT44(fStack_64 * fVar1,local_68 * fVar1);
          uStack_150 = CONCAT44(fStack_5c * fVar1,fStack_60 * fVar1);
          *(undefined8 *)pfVar7 = local_158;
          *(undefined8 *)(pfVar7 + 2) = uStack_150;
        }
      }
      if (iVar8 == 2) {
        for (local_15c = 0; local_15c < iVar3; local_15c = local_15c + 1) {
          local_168 = ncnn::Mat::row(in_RSI,local_15c);
          for (local_16c = 0; local_16c < iVar2; local_16c = local_16c + 1) {
            local_88 = (float)*(undefined8 *)local_168;
            fStack_84 = (float)((ulong)*(undefined8 *)local_168 >> 0x20);
            fStack_80 = (float)*(undefined8 *)(local_168 + 2);
            fStack_7c = (float)((ulong)*(undefined8 *)(local_168 + 2) >> 0x20);
            uStack_180 = CONCAT44(fStack_7c * fVar1,fStack_80 * fVar1);
            *(ulong *)local_168 = CONCAT44(fStack_84 * fVar1,local_88 * fVar1);
            *(undefined8 *)(local_168 + 2) = uStack_180;
            local_168 = local_168 + 4;
          }
        }
      }
      if (iVar8 == 3) {
        for (iVar8 = 0; uVar6 = _fStack_200, iVar8 < iVar4; iVar8 = iVar8 + 1) {
          uVar5 = (ulong)_fStack_200 >> 0x20;
          ncnn::Mat::channel(in_stack_fffffffffffffe08,(int)uVar5);
          pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_1e0);
          ncnn::Mat::~Mat((Mat *)0x379d99);
          _fStack_200 = uVar6;
          for (local_1f0 = 0; local_1f0 < iVar2 * iVar3; local_1f0 = local_1f0 + 1) {
            local_a8 = (float)*(undefined8 *)pfVar7;
            fStack_a4 = (float)((ulong)*(undefined8 *)pfVar7 >> 0x20);
            fStack_a0 = (float)*(undefined8 *)(pfVar7 + 2);
            fStack_9c = (float)((ulong)*(undefined8 *)(pfVar7 + 2) >> 0x20);
            local_208 = CONCAT44(fStack_a4 * fVar1,local_a8 * fVar1);
            _fStack_200 = CONCAT44(fStack_9c * fVar1,fStack_a0 * fVar1);
            *(undefined8 *)pfVar7 = local_208;
            *(undefined8 *)(pfVar7 + 2) = _fStack_200;
            pfVar7 = pfVar7 + 4;
          }
        }
      }
      local_ec = 0;
    }
    else {
      local_ec = Dropout::forward_inplace
                           (in_stack_fffffffffffffe78,
                            (Mat *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                            in_stack_fffffffffffffe68);
    }
  }
  else {
    local_ec = 0;
  }
  return local_ec;
}

Assistant:

int Dropout_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}